

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  pointer puVar1;
  __uniq_ptr_data<wabt::Command,_std::default_delete<wabt::Command>,_true,_true> base;
  Index IVar2;
  ScriptModuleCommand *pSVar3;
  Module *pMVar4;
  
  IVar2 = BindingHash::FindIndex(&this->module_bindings,var);
  puVar1 = (this->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->commands).
                    super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    base.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl =
         puVar1[IVar2]._M_t.
         super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>;
    if (*(CommandType *)
         ((long)base.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8) == ScriptModule) {
      pSVar3 = cast<wabt::ScriptModuleCommand,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
    }
    else {
      if (*(CommandType *)
           ((long)base.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                  _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                  super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8) != First)
      goto LAB_0013c9ff;
      pSVar3 = (ScriptModuleCommand *)
               cast<wabt::ModuleCommand,wabt::Command>
                         ((Command *)
                          base.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
    }
    pMVar4 = &pSVar3->module;
  }
  else {
LAB_0013c9ff:
    pMVar4 = (Module *)0x0;
  }
  return pMVar4;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = commands[index].get();
  if (isa<ModuleCommand>(command)) {
    return &cast<ModuleCommand>(command)->module;
  } else if (isa<ScriptModuleCommand>(command)) {
    return &cast<ScriptModuleCommand>(command)->module;
  }
  return nullptr;
}